

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O3

bool __thiscall FTagManager::SectorHasTag(FTagManager *this,int i,int tag)

{
  FTagItem *pFVar1;
  long lVar2;
  FTagItem *pFVar3;
  bool bVar4;
  
  bVar4 = false;
  if ((-1 < i) && (bVar4 = false, i < (int)(this->startForSector).Count)) {
    lVar2 = (long)(this->startForSector).Array[(uint)i];
    if ((lVar2 < 0) || (pFVar1 = (this->allTags).Array, pFVar1[lVar2].target != i)) {
      return false;
    }
    pFVar1 = pFVar1 + lVar2;
    do {
      pFVar3 = pFVar1 + 1;
      bVar4 = pFVar1->tag == tag;
      if (bVar4) {
        return bVar4;
      }
      pFVar1 = pFVar3;
    } while (pFVar3->target == i);
  }
  return bVar4;
}

Assistant:

bool FTagManager::SectorHasTag(int i, int tag) const
{
	if (SectorHasTags(i))
	{
		int ndx = startForSector[i];
		while (allTags[ndx].target == i)
		{
			if (allTags[ndx].tag == tag) return true;
			ndx++;
		}
	}
	return false;
}